

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall front::symbol::ArraySymbol::~ArraySymbol(ArraySymbol *this)

{
  ~ArraySymbol(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual ~ArraySymbol() {}